

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

unsigned_long xmlHashComputeKey(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3)

{
  byte bVar1;
  xmlChar xVar2;
  xmlChar *pxVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)table->random_seed;
  if (name != (xmlChar *)0x0) {
    uVar5 = (ulong)*name;
    uVar6 = (ulong)*name * 0x20 + uVar5 * -2 + uVar6;
    if (uVar5 != 0) {
      pbVar4 = name + 1;
      do {
        uVar6 = uVar6 ^ (long)(char)uVar5 + (uVar6 >> 3) + uVar6 * 0x20;
        bVar1 = *pbVar4;
        uVar5 = (ulong)bVar1;
        pbVar4 = pbVar4 + 1;
      } while (bVar1 != 0);
    }
  }
  uVar6 = (uVar6 >> 3) + uVar6 * 0x20 ^ uVar6;
  if ((name2 != (xmlChar *)0x0) && (xVar2 = *name2, xVar2 != '\0')) {
    pxVar3 = name2 + 1;
    do {
      uVar6 = uVar6 ^ (long)(char)xVar2 + (uVar6 >> 3) + uVar6 * 0x20;
      xVar2 = *pxVar3;
      pxVar3 = pxVar3 + 1;
    } while (xVar2 != '\0');
  }
  uVar6 = (uVar6 >> 3) + uVar6 * 0x20 ^ uVar6;
  if ((name3 != (xmlChar *)0x0) && (xVar2 = *name3, xVar2 != '\0')) {
    pxVar3 = name3 + 1;
    do {
      uVar6 = uVar6 ^ (long)(char)xVar2 + (uVar6 >> 3) + uVar6 * 0x20;
      xVar2 = *pxVar3;
      pxVar3 = pxVar3 + 1;
    } while (xVar2 != '\0');
  }
  return uVar6 % (ulong)(long)table->size;
}

Assistant:

static unsigned long
xmlHashComputeKey(xmlHashTablePtr table, const xmlChar *name,
	          const xmlChar *name2, const xmlChar *name3) {
    unsigned long value = 0L;
    char ch;

#ifdef HASH_RANDOMIZATION
    value = table->random_seed;
#endif
    if (name != NULL) {
	value += 30 * (*name);
	while ((ch = *name++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
    }
    value = value ^ ((value << 5) + (value >> 3));
    if (name2 != NULL) {
	while ((ch = *name2++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
    }
    value = value ^ ((value << 5) + (value >> 3));
    if (name3 != NULL) {
	while ((ch = *name3++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
    }
    return (value % table->size);
}